

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sesschan.c
# Opt level: O2

void sesschan_check_close_callback(void *vctx)

{
  sesschan *sess;
  
  if ((*(char *)((long)vctx + 0x561) == '\x01') && (*(char *)((long)vctx + 0x562) == '\x01')) {
    (**(code **)(**vctx + 0x10))(*vctx,0);
    return;
  }
  return;
}

Assistant:

static void sesschan_check_close_callback(void *vctx)
{
    sesschan *sess = (sesschan *)vctx;

    /*
     * Once we've seen incoming EOF from the backend (aka EIO from the
     * pty master) and also passed on the process's exit status, we
     * should proactively initiate closure of the session channel.
     */
    if (sess->seen_eof && sess->seen_exit)
        sshfwd_initiate_close(sess->c, NULL);
}